

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

string_view slang::ast::SemanticFacts::getCaseConditionStr(CaseStatementCondition kind)

{
  int in_EDI;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  char *in_stack_fffffffffffffff0;
  char *local_8;
  
  if (in_EDI == 1) {
    bVar1 = sv(in_stack_fffffffffffffff0,0x100000001);
  }
  else if (in_EDI == 2) {
    bVar1 = sv(in_stack_fffffffffffffff0,0x200000002);
  }
  else {
    bVar1 = sv(in_stack_fffffffffffffff0,CONCAT44(in_EDI,in_EDI));
  }
  sVar2._M_len = (size_t)in_stack_fffffffffffffff0;
  sVar2._M_str = local_8;
  return sVar2;
}

Assistant:

std::string_view SemanticFacts::getCaseConditionStr(CaseStatementCondition kind) {
    switch (kind) {
        case CaseStatementCondition::WildcardXOrZ:
            return "casex"sv;
        case CaseStatementCondition::WildcardJustZ:
            return "casez"sv;
        default:
            return "case"sv;
    }
}